

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O3

bool __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)2>::open_fd
          (basic_random_coro_file<(coro_io::execution_type)2> *this,string_view filepath,
          int open_flags)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  bVar4 = true;
  if ((this->prw_random_file_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar4 = false;
    iVar2 = ::open(filepath._M_str,open_flags);
    if (-1 < iVar2) {
      piVar3 = (int *)operator_new(4);
      *piVar3 = iVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<int*,coro_io::basic_random_coro_file<(coro_io::execution_type)2>::open_fd(std::basic_string_view<char,std::char_traits<char>>,int)::_lambda(int*)_1_,std::allocator<void>,void>
                (&_Stack_20,piVar3);
      _Var1._M_pi = _Stack_20._M_pi;
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->prw_random_file_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->prw_random_file_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = piVar3;
      (this->prw_random_file_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Var1._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
        }
      }
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool open_fd(std::string_view filepath, int open_flags) {
    if (prw_random_file_) {
      return true;
    }

#if defined(ASIO_WINDOWS)
    int fd = _open(filepath.data(), adjust_flags(open_flags));
#else
    int fd = ::open(filepath.data(), open_flags);
#endif
    if (fd < 0) {
      return false;
    }

    prw_random_file_ = std::shared_ptr<int>(new int(fd), [](int *ptr) {
#if defined(ASIO_WINDOWS)
      _close(*ptr);
#else
      ::close(*ptr);
#endif
      delete ptr;
    });
    return true;
  }